

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImGuiWindow *this;
  ImVec2 p_min;
  ImVec2 p_min_00;
  ImVec2 p_max;
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 fill_col;
  int iVar4;
  ImGuiCol idx;
  float fVar5;
  float fVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  bool held;
  bool hovered;
  ImRect bb;
  bool local_72;
  bool local_71;
  ImVec2 local_70;
  ImRect local_68;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar1 = GImGui;
  local_48 = size.y;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_58._8_4_ = in_XMM0_Dc;
    local_58._0_8_ = size;
    local_58._12_4_ = in_XMM0_Dd;
    local_70 = size;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    local_68.Min.x = (this->DC).CursorPos.x;
    local_68.Min.y = (this->DC).CursorPos.y;
    local_68.Max.x = (float)local_58._0_4_ + local_68.Min.x;
    local_68.Max.y = (float)local_58._4_4_ + local_68.Min.y;
    fVar5 = GetFrameHeight();
    fVar6 = 0.0;
    if (fVar5 <= local_48) {
      fVar6 = (pIVar1->Style).FramePadding.y;
    }
    ItemSize(&local_70,fVar6);
    bVar3 = false;
    bVar2 = ItemAdd(&local_68,id,(ImRect *)0x0);
    if (bVar2) {
      bVar3 = ButtonBehavior(&local_68,id,&local_71,&local_72,
                             (uint)(this->DC).ItemFlags >> 1 & 1 | flags);
      iVar4 = ((local_72 ^ 1U) & local_71) + 0x15;
      idx = 0x17;
      if ((local_71 & 1U) == 0) {
        idx = iVar4;
      }
      if (local_72 == false) {
        idx = iVar4;
      }
      fill_col = GetColorU32(idx,1.0);
      RenderNavHighlight(&local_68,id,1);
      p_min_00.y = local_68.Min.y;
      p_min_00.x = local_68.Min.x;
      p_max.y = local_68.Max.y;
      p_max.x = local_68.Max.x;
      RenderFrame(p_min_00,p_max,fill_col,true,(pIVar1->Style).FrameRounding);
      fVar6 = (local_70.x - pIVar1->FontSize) * 0.5;
      fVar5 = (local_70.y - pIVar1->FontSize) * 0.5;
      p_min.y = local_68.Min.y + (float)(-(uint)(0.0 < fVar5) & (uint)fVar5);
      p_min.x = local_68.Min.x + (float)(-(uint)(0.0 < fVar6) & (uint)fVar6);
      RenderArrow(p_min,dir,1.0);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : 0.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, g.Style.FrameRounding);
    RenderArrow(bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), dir);

    return pressed;
}